

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  undefined2 in_register_00000012;
  CustomRect local_28;
  
  local_28.ID = CONCAT22(in_register_00000012,id);
  local_28.X = 0xffff;
  local_28.Y = 0xffff;
  local_28.Width = (unsigned_short)width;
  local_28.Height = (unsigned_short)height;
  local_28.GlyphOffset = *offset;
  local_28.GlyphAdvanceX = advance_x;
  local_28.Font = font;
  ImVector<ImFontAtlas::CustomRect>::push_back(&this->CustomRects,&local_28);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}